

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_mqdec.c
# Opt level: O1

void jpc_mqdec_init(jpc_mqdec_t *mqdec)

{
  uchar uVar1;
  int iVar2;
  jas_stream_t *pjVar3;
  byte *pbVar4;
  uint uVar5;
  uint_fast32_t uVar6;
  long lVar7;
  long lVar8;
  
  mqdec->eof = 0;
  mqdec->creg = 0;
  pjVar3 = mqdec->in;
  uVar5 = 0xffffffff;
  if ((pjVar3->flags_ & 7U) == 0) {
    if ((pjVar3->rwlimit_ < 0) || (pjVar3->rwcnt_ < pjVar3->rwlimit_)) {
      iVar2 = pjVar3->cnt_;
      pjVar3->cnt_ = iVar2 + -1;
      if (iVar2 < 1) {
        uVar5 = jas_stream_fillbuf(pjVar3,1);
      }
      else {
        pjVar3->rwcnt_ = pjVar3->rwcnt_ + 1;
        pbVar4 = pjVar3->ptr_;
        pjVar3->ptr_ = pbVar4 + 1;
        uVar5 = (uint)*pbVar4;
      }
    }
    else {
      pjVar3->flags_ = pjVar3->flags_ | 4;
    }
  }
  if (uVar5 == 0xffffffff) {
    mqdec->eof = 1;
    uVar5 = 0xff;
  }
  mqdec->inbuffer = (uchar)uVar5;
  uVar6 = (ulong)((uVar5 & 0xff) << 0x10) + mqdec->creg;
  mqdec->creg = uVar6;
  if (mqdec->eof == 0) {
    pjVar3 = mqdec->in;
    uVar5 = 0xffffffff;
    if ((pjVar3->flags_ & 7U) == 0) {
      if ((pjVar3->rwlimit_ < 0) || (pjVar3->rwcnt_ < pjVar3->rwlimit_)) {
        iVar2 = pjVar3->cnt_;
        pjVar3->cnt_ = iVar2 + -1;
        if (iVar2 < 1) {
          uVar5 = jas_stream_fillbuf(pjVar3,1);
        }
        else {
          pjVar3->rwcnt_ = pjVar3->rwcnt_ + 1;
          pbVar4 = pjVar3->ptr_;
          pjVar3->ptr_ = pbVar4 + 1;
          uVar5 = (uint)*pbVar4;
        }
      }
      else {
        pjVar3->flags_ = pjVar3->flags_ | 4;
      }
    }
    if (uVar5 == 0xffffffff) {
      mqdec->eof = 1;
      uVar5 = 0xff;
    }
    uVar1 = mqdec->inbuffer;
    mqdec->inbuffer = (uchar)uVar5;
    if (uVar1 == 0xff) {
      if ((int)uVar5 < 0x90) {
        lVar7 = (long)(int)(uVar5 << 9) + mqdec->creg;
        lVar8 = 7;
        goto LAB_00122bd3;
      }
      lVar7 = 0xff00;
    }
    else {
      lVar7 = (long)(int)(uVar5 << 8);
    }
    lVar7 = lVar7 + mqdec->creg;
  }
  else {
    lVar7 = uVar6 + 0xff00;
  }
  lVar8 = 8;
LAB_00122bd3:
  mqdec->creg = lVar7 << 7;
  mqdec->ctreg = lVar8 - 7;
  mqdec->areg = 0x8000;
  return;
}

Assistant:

void jpc_mqdec_init(jpc_mqdec_t *mqdec)
{
	int c;

	mqdec->eof = 0;
	mqdec->creg = 0;
	/* Get the next byte from the input stream. */
	if ((c = jas_stream_getc(mqdec->in)) == EOF) {
		/* We have encountered an I/O error or EOF. */
		c = 0xff;
		mqdec->eof = 1;
	}
	mqdec->inbuffer = c;
	mqdec->creg += mqdec->inbuffer << 16;
	jpc_mqdec_bytein(mqdec);
	mqdec->creg <<= 7;
	mqdec->ctreg -= 7;
	mqdec->areg = 0x8000;
}